

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apu.cpp
# Opt level: O0

void __thiscall
trackerboy::apu::Hardware::run(Hardware *this,Mixer *mixer,uint32_t cycletime,uint32_t cycles)

{
  uint *puVar1;
  __tuple_element_t<0UL,_tuple<PulseChannel,_PulseChannel,_WaveChannel,_NoiseChannel>_> *ch;
  __tuple_element_t<1UL,_tuple<PulseChannel,_PulseChannel,_WaveChannel,_NoiseChannel>_> *ch_00;
  __tuple_element_t<2UL,_tuple<PulseChannel,_PulseChannel,_WaveChannel,_NoiseChannel>_> *ch_01;
  __tuple_element_t<3UL,_tuple<PulseChannel,_PulseChannel,_WaveChannel,_NoiseChannel>_> *ch_02;
  uint32_t local_28;
  uint32_t local_24;
  uint32_t local_20;
  uint toStep;
  uint32_t cycles_local;
  uint32_t cycletime_local;
  Mixer *mixer_local;
  Hardware *this_local;
  
  toStep = cycletime;
  _cycles_local = mixer;
  mixer_local = (Mixer *)this;
  for (local_20 = cycles; local_20 != 0; local_20 = local_20 - local_24) {
    local_28 = Sequencer::cyclesToNextTrigger(&this->mSequencer);
    puVar1 = std::min<unsigned_int>(&local_20,&local_28);
    local_24 = *puVar1;
    ch = std::
         get<0ul,trackerboy::apu::PulseChannel,trackerboy::apu::PulseChannel,trackerboy::apu::WaveChannel,trackerboy::apu::NoiseChannel>
                   (&this->mChannels);
    runChannel<trackerboy::apu::PulseChannel>(this,0,ch,_cycles_local,toStep,local_24);
    ch_00 = std::
            get<1ul,trackerboy::apu::PulseChannel,trackerboy::apu::PulseChannel,trackerboy::apu::WaveChannel,trackerboy::apu::NoiseChannel>
                      (&this->mChannels);
    runChannel<trackerboy::apu::PulseChannel>(this,1,ch_00,_cycles_local,toStep,local_24);
    ch_01 = std::
            get<2ul,trackerboy::apu::PulseChannel,trackerboy::apu::PulseChannel,trackerboy::apu::WaveChannel,trackerboy::apu::NoiseChannel>
                      (&this->mChannels);
    runChannel<trackerboy::apu::WaveChannel>(this,2,ch_01,_cycles_local,toStep,local_24);
    ch_02 = std::
            get<3ul,trackerboy::apu::PulseChannel,trackerboy::apu::PulseChannel,trackerboy::apu::WaveChannel,trackerboy::apu::NoiseChannel>
                      (&this->mChannels);
    runChannel<trackerboy::apu::NoiseChannel>(this,3,ch_02,_cycles_local,toStep,local_24);
    Sequencer::run(&this->mSequencer,this,local_24);
    toStep = local_24 + toStep;
  }
  return;
}

Assistant:

void Hardware::run(Mixer &mixer, uint32_t cycletime, uint32_t cycles) noexcept {
    while (cycles) {
        // step components to the beat of the sequencer
        auto toStep = std::min(cycles, mSequencer.cyclesToNextTrigger());
        runChannel(0, std::get<0>(mChannels), mixer, cycletime, toStep);
        runChannel(1, std::get<1>(mChannels), mixer, cycletime, toStep);
        runChannel(2, std::get<2>(mChannels), mixer, cycletime, toStep);
        runChannel(3, std::get<3>(mChannels), mixer, cycletime, toStep);
        mSequencer.run(*this, toStep);

        cycletime += toStep;
        cycles -= toStep;
    }
}